

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_decoder.hpp
# Opt level: O1

void __thiscall
duckdb::RleBpDecoder::GetBatch<unsigned_int>
          (RleBpDecoder *this,data_ptr_t values_target_ptr,uint32_t batch_size)

{
  long lVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint __tmp;
  ulong uVar5;
  long lVar6;
  uint32_t uVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (batch_size != 0) {
    uVar8 = 0;
    auVar14 = _DAT_01dd8ba0;
    auVar15 = _DAT_01dd7b30;
    auVar16 = _DAT_01dd7b40;
    do {
      uVar2 = this->repeat_count_;
      uVar7 = (uint32_t)uVar8;
      if (uVar2 == 0) {
        uVar2 = this->literal_count_;
        if (uVar2 == 0) {
          NextCounts(this);
          auVar14 = _DAT_01dd8ba0;
          auVar15 = _DAT_01dd7b30;
          auVar16 = _DAT_01dd7b40;
        }
        else {
          uVar4 = batch_size - uVar7;
          if (uVar2 <= batch_size - uVar7) {
            uVar4 = uVar2;
          }
          ParquetDecodeUtils::BitUnpack<unsigned_int>
                    (&this->buffer_,&this->bitpack_pos,(uint *)(values_target_ptr + uVar8 * 4),
                     (ulong)uVar4,(bitpacking_width_t)this->bit_width_);
          this->literal_count_ = this->literal_count_ - uVar4;
          uVar8 = (ulong)(uVar4 + uVar7);
          auVar14 = _DAT_01dd8ba0;
          auVar15 = _DAT_01dd7b30;
          auVar16 = _DAT_01dd7b40;
        }
      }
      else {
        uVar4 = batch_size - uVar7;
        if (uVar2 <= batch_size - uVar7) {
          uVar4 = uVar2;
        }
        if (batch_size != uVar7) {
          uVar3 = (undefined4)this->current_value_;
          uVar5 = (ulong)uVar4 + 0x3fffffffffffffff & 0x3fffffffffffffff;
          auVar9._8_4_ = (int)uVar5;
          auVar9._0_8_ = uVar5;
          auVar9._12_4_ = (int)(uVar5 >> 0x20);
          lVar1 = uVar8 * 4;
          auVar9 = auVar9 ^ auVar16;
          lVar6 = 0;
          do {
            auVar11._8_4_ = (int)lVar6;
            auVar11._0_8_ = lVar6;
            auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar12 = (auVar11 | auVar15) ^ auVar16;
            iVar10 = auVar9._4_4_;
            if ((bool)(~(iVar10 < auVar12._4_4_ ||
                        auVar9._0_4_ < auVar12._0_4_ && auVar12._4_4_ == iVar10) & 1)) {
              *(undefined4 *)(values_target_ptr + lVar6 * 4 + lVar1) = uVar3;
            }
            if (auVar12._12_4_ <= auVar9._12_4_ &&
                (auVar12._8_4_ <= auVar9._8_4_ || auVar12._12_4_ != auVar9._12_4_)) {
              *(undefined4 *)(values_target_ptr + lVar6 * 4 + lVar1 + 4) = uVar3;
            }
            auVar11 = (auVar11 | auVar14) ^ auVar16;
            iVar13 = auVar11._4_4_;
            if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
              *(undefined4 *)(values_target_ptr + lVar6 * 4 + lVar1 + 8) = uVar3;
              *(undefined4 *)(values_target_ptr + lVar6 * 4 + lVar1 + 0xc) = uVar3;
            }
            lVar6 = lVar6 + 4;
          } while ((uVar5 - ((uint)((ulong)uVar4 + 0x3fffffffffffffff) & 3)) + 4 != lVar6);
        }
        this->repeat_count_ = this->repeat_count_ - uVar4;
        uVar8 = (ulong)(uVar7 + uVar4);
      }
    } while ((uint)uVar8 < batch_size);
  }
  return;
}

Assistant:

void GetBatch(data_ptr_t values_target_ptr, const uint32_t batch_size) {
		auto values = reinterpret_cast<T *>(values_target_ptr);
		uint32_t values_read = 0;

		while (values_read < batch_size) {
			if (repeat_count_ > 0) {
				auto repeat_batch = MinValue<uint32_t>(batch_size - values_read, repeat_count_);
				std::fill_n(values + values_read, repeat_batch, static_cast<T>(current_value_));
				repeat_count_ -= repeat_batch;
				values_read += repeat_batch;
			} else if (literal_count_ > 0) {
				auto literal_batch = MinValue<uint32_t>(batch_size - values_read, literal_count_);
				ParquetDecodeUtils::BitUnpack<T>(buffer_, bitpack_pos, values + values_read, literal_batch, bit_width_);
				literal_count_ -= literal_batch;
				values_read += literal_batch;
			} else {
				NextCounts();
			}
		}
		D_ASSERT(values_read == batch_size);
	}